

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O0

void tcu::anon_unknown_0::EtcDecompressInternal::decompressETC2Block
               (deUint8 *dst,deUint64 src,deUint8 *alphaDst,bool alphaMode)

{
  deUint8 src_00;
  deUint8 src_01;
  deUint8 src_02;
  deInt8 dVar1;
  deInt8 dVar2;
  deInt8 dVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  deUint32 dVar14;
  deUint32 dVar15;
  deUint32 dVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  deUint32 dVar20;
  uint uVar21;
  deUint32 dVar22;
  deUint32 dVar23;
  deUint32 dVar24;
  deUint32 dVar25;
  deUint32 dVar26;
  deUint32 dVar27;
  uint uVar28;
  int iVar29;
  int local_f0;
  int alphaDstOffset_2;
  int unclampedB;
  int unclampedG;
  int unclampedR;
  int dstOffset_2;
  int x_2;
  int y_2;
  deUint8 BV;
  deUint8 GV;
  deUint8 RV;
  deUint8 BH;
  deUint8 GH;
  deUint8 RH;
  deUint8 BO;
  deUint8 GO;
  deUint8 RO;
  deUint8 RH2;
  deUint8 RH1;
  deUint8 BO3;
  deUint8 BO2;
  deUint8 BO1;
  deUint8 GO2;
  deUint8 GO1;
  int alphaDstOffset_1;
  deUint32 paintNdx;
  int dstOffset_1;
  int y_1;
  int x_1;
  int pixelNdx_1;
  int dist_1;
  deUint32 distNdx_1;
  deUint32 baseValue [2];
  deUint8 baseB_1 [2];
  deUint8 baseG_1 [2];
  deUint8 baseR_1 [2];
  deUint8 B2_1;
  deUint8 G2_1;
  deUint8 R2_1;
  deUint8 B1b;
  deUint8 B1a;
  deUint8 G1b;
  deUint8 G1a;
  deUint8 R1;
  int dist;
  deUint32 distNdx;
  byte local_78;
  deUint8 B2;
  deUint8 G2;
  deUint8 R2;
  deUint8 B1;
  deUint8 G1;
  deUint8 R1b;
  deUint8 R1a;
  deUint8 paintB [4];
  deUint8 paintG [4];
  deUint8 paintR [4];
  int modifier;
  int alphaDstOffset;
  deUint32 modifierNdx;
  deUint32 tableNdx;
  int subBlock;
  int dstOffset;
  int y;
  int x;
  int pixelNdx;
  deUint32 dStack_40;
  deUint8 baseB [2];
  deUint8 baseG [2];
  deUint8 baseR [2];
  deUint32 table [2];
  int flipBit;
  Etc2Mode mode;
  deInt8 selDB;
  deInt8 selDG;
  deInt8 selDR;
  deInt8 selBB;
  deInt8 selBG;
  deInt8 selBR;
  int diffOpaqueBit;
  bool alphaMode_local;
  deUint8 *alphaDst_local;
  deUint64 src_local;
  deUint8 *dst_local;
  
  dVar14 = getBit(src,0x21);
  dVar15 = getBits(src,0x3b,0x3f);
  src_00 = (deUint8)dVar15;
  dVar15 = getBits(src,0x33,0x37);
  src_01 = (deUint8)dVar15;
  dVar15 = getBits(src,0x2b,0x2f);
  src_02 = (deUint8)dVar15;
  dVar15 = getBits(src,0x38,0x3a);
  dVar1 = extendSigned3To8((deUint8)dVar15);
  dVar15 = getBits(src,0x30,0x32);
  dVar2 = extendSigned3To8((deUint8)dVar15);
  dVar15 = getBits(src,0x28,0x2a);
  dVar3 = extendSigned3To8((deUint8)dVar15);
  if ((alphaMode) || (dVar14 != 0)) {
    bVar4 = de::inRange<int>((int)(char)src_00 + (int)dVar1,0,0x1f);
    if (bVar4) {
      bVar4 = de::inRange<int>((int)(char)src_01 + (int)dVar2,0,0x1f);
      if (bVar4) {
        bVar4 = de::inRange<int>((int)(char)src_02 + (int)dVar3,0,0x1f);
        if (bVar4) {
          table[1] = 1;
        }
        else {
          table[1] = 4;
        }
      }
      else {
        table[1] = 3;
      }
    }
    else {
      table[1] = 2;
    }
  }
  else {
    table[1] = 0;
  }
  if ((table[1] == 0) || (table[1] == 1)) {
    dVar15 = getBit(src,0x20);
    dStack_40 = getBits(src,0x25,0x27);
    getBits(src,0x22,0x24);
    if (table[1] == 0) {
      dVar16 = getBits(src,0x3c,0x3f);
      pixelNdx._2_1_ = extend4To8((deUint8)dVar16);
      dVar16 = getBits(src,0x38,0x3b);
      pixelNdx._3_1_ = extend4To8((deUint8)dVar16);
      dVar16 = getBits(src,0x34,0x37);
      pixelNdx._0_1_ = extend4To8((deUint8)dVar16);
      dVar16 = getBits(src,0x30,0x33);
      pixelNdx._1_1_ = extend4To8((deUint8)dVar16);
      dVar16 = getBits(src,0x2c,0x2f);
      x._2_1_ = extend4To8((deUint8)dVar16);
      dVar16 = getBits(src,0x28,0x2b);
      x._3_1_ = extend4To8((deUint8)dVar16);
    }
    else {
      pixelNdx._2_1_ = extend5To8(src_00);
      pixelNdx._0_1_ = extend5To8(src_01);
      x._2_1_ = extend5To8(src_02);
      pixelNdx._3_1_ = extend5To8(src_00 + dVar1);
      pixelNdx._1_1_ = extend5To8(src_01 + dVar2);
      x._3_1_ = extend5To8(src_02 + dVar3);
    }
    for (y = 0; y < 0x10; y = y + 1) {
      iVar17 = y / 4;
      iVar29 = y % 4;
      iVar18 = (iVar29 * 4 + iVar17) * 3;
      local_f0 = iVar17;
      if (dVar15 != 0) {
        local_f0 = iVar29;
      }
      uVar19 = (uint)(1 < local_f0);
      uVar28 = *(uint *)((long)&stack0xffffffffffffffc0 + (long)(int)uVar19 * 4);
      dVar16 = getBit(src,y + 0x10);
      dVar20 = getBit(src,y);
      uVar21 = dVar16 << 1 | dVar20;
      iVar17 = iVar29 * 4 + iVar17;
      if (((alphaMode) && (dVar14 == 0)) && (uVar21 == 2)) {
        dst[iVar18] = '\0';
        dst[iVar18 + 1] = '\0';
        dst[iVar18 + 2] = '\0';
        alphaDst[iVar17] = '\0';
      }
      else {
        if (((alphaMode) && (dVar14 == 0)) && ((uVar21 == 0 || (uVar21 == 2)))) {
          paintG[0] = '\0';
          paintG[1] = '\0';
          paintG[2] = '\0';
          paintG[3] = '\0';
        }
        else {
          paintG = (deUint8  [4])decompressETC2Block::modifierTable[uVar28][uVar21];
        }
        iVar29 = deClamp32((uint)*(byte *)((long)&pixelNdx + (long)(int)uVar19 + 2) + (int)paintG,0,
                           0xff);
        dst[iVar18] = (deUint8)iVar29;
        iVar29 = deClamp32((uint)*(byte *)((long)&pixelNdx + (long)(int)uVar19) + (int)paintG,0,0xff
                          );
        dst[iVar18 + 1] = (deUint8)iVar29;
        iVar29 = deClamp32((uint)*(byte *)((long)&x + (long)(int)uVar19 + 2) + (int)paintG,0,0xff);
        dst[iVar18 + 2] = (deUint8)iVar29;
        if (alphaMode) {
          alphaDst[iVar17] = 0xff;
        }
      }
    }
  }
  else if ((table[1] == 2) || (table[1] == 3)) {
    if (table[1] == 2) {
      dVar15 = getBits(src,0x3b,0x3c);
      dVar16 = getBits(src,0x38,0x39);
      dVar20 = getBits(src,0x34,0x37);
      dVar22 = getBits(src,0x30,0x33);
      dVar23 = getBits(src,0x2c,0x2f);
      dVar24 = getBits(src,0x28,0x2b);
      dVar25 = getBits(src,0x24,0x27);
      dVar26 = getBits(src,0x22,0x23);
      dVar27 = getBit(src,0x20);
      iVar18 = decompressETC2Block::distTable[dVar26 << 1 | dVar27];
      paintB[0] = extend4To8((char)dVar15 << 2 | (byte)dVar16);
      B1 = extend4To8((deUint8)dVar20);
      local_78 = extend4To8((deUint8)dVar22);
      paintB[2] = extend4To8((deUint8)dVar23);
      R1b = extend4To8((deUint8)dVar24);
      G2 = extend4To8((deUint8)dVar25);
      iVar17 = deClamp32((uint)paintB[2] + iVar18,0,0xff);
      paintB[1] = (deUint8)iVar17;
      iVar17 = deClamp32((uint)R1b + iVar18,0,0xff);
      G1 = (deUint8)iVar17;
      iVar17 = deClamp32((uint)G2 + iVar18,0,0xff);
      B2 = (deUint8)iVar17;
      iVar17 = deClamp32((uint)paintB[2] - iVar18,0,0xff);
      paintB[3] = (deUint8)iVar17;
      iVar17 = deClamp32((uint)R1b - iVar18,0,0xff);
      R1a = (deUint8)iVar17;
      iVar18 = deClamp32((uint)G2 - iVar18,0,0xff);
      R2 = (deUint8)iVar18;
    }
    else {
      dVar15 = getBits(src,0x3b,0x3e);
      dVar16 = getBits(src,0x38,0x3a);
      dVar20 = getBit(src,0x34);
      dVar22 = getBit(src,0x33);
      dVar23 = getBits(src,0x2f,0x31);
      dVar24 = getBits(src,0x2b,0x2e);
      dVar25 = getBits(src,0x27,0x2a);
      dVar26 = getBits(src,0x23,0x26);
      bVar5 = extend4To8((deUint8)dVar15);
      bVar6 = extend4To8((char)dVar16 << 1 | (byte)dVar20);
      bVar7 = extend4To8((char)dVar22 << 3 | (byte)dVar23);
      bVar8 = extend4To8((deUint8)dVar24);
      bVar9 = extend4To8((deUint8)dVar25);
      bVar10 = extend4To8((deUint8)dVar26);
      dVar15 = getBit(src,0x22);
      dVar16 = getBit(src,0x20);
      iVar18 = decompressETC2Block::distTable
               [dVar15 << 2 | dVar16 << 1 |
                (uint)(((uint)bVar8 << 0x10 | (uint)bVar9 << 8 | (uint)bVar10) <=
                      ((uint)bVar5 << 0x10 | (uint)bVar6 << 8 | (uint)bVar7))];
      iVar17 = deClamp32((uint)bVar5 + iVar18,0,0xff);
      paintB[0] = (deUint8)iVar17;
      iVar17 = deClamp32((uint)bVar6 + iVar18,0,0xff);
      B1 = (deUint8)iVar17;
      iVar17 = deClamp32((uint)bVar7 + iVar18,0,0xff);
      local_78 = (byte)iVar17;
      iVar17 = deClamp32((uint)bVar5 - iVar18,0,0xff);
      paintB[1] = (deUint8)iVar17;
      iVar17 = deClamp32((uint)bVar6 - iVar18,0,0xff);
      G1 = (deUint8)iVar17;
      iVar17 = deClamp32((uint)bVar7 - iVar18,0,0xff);
      B2 = (deUint8)iVar17;
      iVar17 = deClamp32((uint)bVar8 + iVar18,0,0xff);
      paintB[2] = (deUint8)iVar17;
      iVar17 = deClamp32((uint)bVar9 + iVar18,0,0xff);
      R1b = (deUint8)iVar17;
      iVar17 = deClamp32((uint)bVar10 + iVar18,0,0xff);
      G2 = (deUint8)iVar17;
      iVar17 = deClamp32((uint)bVar8 - iVar18,0,0xff);
      paintB[3] = (deUint8)iVar17;
      iVar17 = deClamp32((uint)bVar9 - iVar18,0,0xff);
      R1a = (deUint8)iVar17;
      iVar18 = deClamp32((uint)bVar10 - iVar18,0,0xff);
      R2 = (deUint8)iVar18;
    }
    for (y_1 = 0; y_1 < 0x10; y_1 = y_1 + 1) {
      iVar18 = ((y_1 % 4) * 4 + y_1 / 4) * 3;
      dVar15 = getBit(src,y_1 + 0x10);
      dVar16 = getBit(src,y_1);
      uVar28 = dVar15 << 1 | dVar16;
      iVar17 = (y_1 % 4) * 4 + y_1 / 4;
      if (((alphaMode) && (dVar14 == 0)) && (uVar28 == 2)) {
        dst[iVar18] = '\0';
        dst[iVar18 + 1] = '\0';
        dst[iVar18 + 2] = '\0';
        alphaDst[iVar17] = '\0';
      }
      else {
        iVar29 = deClamp32((uint)paintB[uVar28],0,0xff);
        dst[iVar18] = (deUint8)iVar29;
        iVar29 = deClamp32((uint)(&B1)[uVar28],0,0xff);
        dst[iVar18 + 1] = (deUint8)iVar29;
        iVar29 = deClamp32((uint)(&local_78)[uVar28],0,0xff);
        dst[iVar18 + 2] = (deUint8)iVar29;
        if (alphaMode) {
          alphaDst[iVar17] = 0xff;
        }
      }
    }
  }
  else {
    dVar14 = getBit(src,0x38);
    dVar15 = getBits(src,0x31,0x36);
    dVar16 = getBit(src,0x30);
    dVar20 = getBits(src,0x2b,0x2c);
    dVar22 = getBits(src,0x27,0x29);
    dVar23 = getBits(src,0x22,0x26);
    dVar24 = getBit(src,0x20);
    dVar25 = getBits(src,0x39,0x3e);
    bVar5 = extend6To8((deUint8)dVar25);
    bVar6 = extend7To8((char)dVar14 << 6 | (byte)dVar15);
    bVar7 = extend6To8((char)dVar16 << 5 | (char)dVar20 << 3 | (byte)dVar22);
    bVar8 = extend6To8((char)dVar23 << 1 | (byte)dVar24);
    dVar14 = getBits(src,0x19,0x1f);
    bVar9 = extend7To8((deUint8)dVar14);
    dVar14 = getBits(src,0x13,0x18);
    bVar10 = extend6To8((deUint8)dVar14);
    dVar14 = getBits(src,0xd,0x12);
    bVar11 = extend6To8((deUint8)dVar14);
    dVar14 = getBits(src,6,0xc);
    bVar12 = extend7To8((deUint8)dVar14);
    dVar14 = getBits(src,0,5);
    bVar13 = extend6To8((deUint8)dVar14);
    for (dstOffset_2 = 0; dstOffset_2 < 4; dstOffset_2 = dstOffset_2 + 1) {
      for (unclampedR = 0; unclampedR < 4; unclampedR = unclampedR + 1) {
        iVar18 = (dstOffset_2 * 4 + unclampedR) * 3;
        iVar17 = deClamp32((int)(unclampedR * ((uint)bVar8 - (uint)bVar5) +
                                 dstOffset_2 * ((uint)bVar11 - (uint)bVar5) + (uint)bVar5 * 4 + 2)
                           >> 2,0,0xff);
        dst[iVar18] = (deUint8)iVar17;
        iVar17 = deClamp32((int)(unclampedR * ((uint)bVar9 - (uint)bVar6) +
                                 dstOffset_2 * ((uint)bVar12 - (uint)bVar6) + (uint)bVar6 * 4 + 2)
                           >> 2,0,0xff);
        dst[iVar18 + 1] = (deUint8)iVar17;
        iVar17 = deClamp32((int)(unclampedR * ((uint)bVar10 - (uint)bVar7) +
                                 dstOffset_2 * ((uint)bVar13 - (uint)bVar7) + (uint)bVar7 * 4 + 2)
                           >> 2,0,0xff);
        dst[iVar18 + 2] = (deUint8)iVar17;
        if (alphaMode) {
          alphaDst[dstOffset_2 * 4 + unclampedR] = 0xff;
        }
      }
    }
  }
  return;
}

Assistant:

void decompressETC2Block (deUint8 dst[ETC2_UNCOMPRESSED_BLOCK_SIZE_RGB8], deUint64 src, deUint8 alphaDst[ETC2_UNCOMPRESSED_BLOCK_SIZE_A8], bool alphaMode)
{
	enum Etc2Mode
	{
		MODE_INDIVIDUAL = 0,
		MODE_DIFFERENTIAL,
		MODE_T,
		MODE_H,
		MODE_PLANAR,

		MODE_LAST
	};

	const int		diffOpaqueBit	= (int)getBit(src, 33);
	const deInt8	selBR			= (deInt8)getBits(src, 59, 63);	// 5 bits.
	const deInt8	selBG			= (deInt8)getBits(src, 51, 55);
	const deInt8	selBB			= (deInt8)getBits(src, 43, 47);
	const deInt8	selDR			= extendSigned3To8((deUint8)getBits(src, 56, 58)); // 3 bits.
	const deInt8	selDG			= extendSigned3To8((deUint8)getBits(src, 48, 50));
	const deInt8	selDB			= extendSigned3To8((deUint8)getBits(src, 40, 42));
	Etc2Mode		mode;

	if (!alphaMode && diffOpaqueBit == 0)
		mode = MODE_INDIVIDUAL;
	else if (!de::inRange(selBR + selDR, 0, 31))
		mode = MODE_T;
	else if (!de::inRange(selBG + selDG, 0, 31))
		mode = MODE_H;
	else if (!de::inRange(selBB + selDB, 0, 31))
		mode = MODE_PLANAR;
	else
		mode = MODE_DIFFERENTIAL;

	if (mode == MODE_INDIVIDUAL || mode == MODE_DIFFERENTIAL)
	{
		// Individual and differential modes have some steps in common, handle them here.
		static const int modifierTable[8][4] =
		{
		//	  00   01   10    11
			{  2,   8,  -2,   -8 },
			{  5,  17,  -5,  -17 },
			{  9,  29,  -9,  -29 },
			{ 13,  42, -13,  -42 },
			{ 18,  60, -18,  -60 },
			{ 24,  80, -24,  -80 },
			{ 33, 106, -33, -106 },
			{ 47, 183, -47, -183 }
		};

		const int		flipBit		= (int)getBit(src, 32);
		const deUint32	table[2]	= { getBits(src, 37, 39), getBits(src, 34, 36) };
		deUint8			baseR[2];
		deUint8			baseG[2];
		deUint8			baseB[2];

		if (mode == MODE_INDIVIDUAL)
		{
			// Individual mode, initial values.
			baseR[0] = extend4To8((deUint8)getBits(src, 60, 63));
			baseR[1] = extend4To8((deUint8)getBits(src, 56, 59));
			baseG[0] = extend4To8((deUint8)getBits(src, 52, 55));
			baseG[1] = extend4To8((deUint8)getBits(src, 48, 51));
			baseB[0] = extend4To8((deUint8)getBits(src, 44, 47));
			baseB[1] = extend4To8((deUint8)getBits(src, 40, 43));
		}
		else
		{
			// Differential mode, initial values.
			baseR[0] = extend5To8(selBR);
			baseG[0] = extend5To8(selBG);
			baseB[0] = extend5To8(selBB);

			baseR[1] = extend5To8((deUint8)(selBR + selDR));
			baseG[1] = extend5To8((deUint8)(selBG + selDG));
			baseB[1] = extend5To8((deUint8)(selBB + selDB));
		}

		// Write final pixels for individual or differential mode.
		for (int pixelNdx = 0; pixelNdx < ETC2_BLOCK_HEIGHT*ETC2_BLOCK_WIDTH; pixelNdx++)
		{
			const int		x				= pixelNdx / ETC2_BLOCK_HEIGHT;
			const int		y				= pixelNdx % ETC2_BLOCK_HEIGHT;
			const int		dstOffset		= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_RGB8;
			const int		subBlock		= ((flipBit ? y : x) >= 2) ? 1 : 0;
			const deUint32	tableNdx		= table[subBlock];
			const deUint32	modifierNdx		= (getBit(src, 16+pixelNdx) << 1) | getBit(src, pixelNdx);
			const int		alphaDstOffset	= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_A8; // Only needed for PUNCHTHROUGH version.

			// If doing PUNCHTHROUGH version (alphaMode), opaque bit may affect colors.
			if (alphaMode && diffOpaqueBit == 0 && modifierNdx == 2)
			{
				dst[dstOffset+0]			= 0;
				dst[dstOffset+1]			= 0;
				dst[dstOffset+2]			= 0;
				alphaDst[alphaDstOffset]	= 0;
			}
			else
			{
				int modifier;

				// PUNCHTHROUGH version and opaque bit may also affect modifiers.
				if (alphaMode && diffOpaqueBit == 0 && (modifierNdx == 0 || modifierNdx == 2))
					modifier = 0;
				else
					modifier = modifierTable[tableNdx][modifierNdx];

				dst[dstOffset+0] = (deUint8)deClamp32((int)baseR[subBlock] + modifier, 0, 255);
				dst[dstOffset+1] = (deUint8)deClamp32((int)baseG[subBlock] + modifier, 0, 255);
				dst[dstOffset+2] = (deUint8)deClamp32((int)baseB[subBlock] + modifier, 0, 255);

				if (alphaMode)
					alphaDst[alphaDstOffset] = 255;
			}
		}
	}
	else if (mode == MODE_T || mode == MODE_H)
	{
		// T and H modes have some steps in common, handle them here.
		static const int distTable[8] = { 3, 6, 11, 16, 23, 32, 41, 64 };

		deUint8 paintR[4];
		deUint8 paintG[4];
		deUint8 paintB[4];

		if (mode == MODE_T)
		{
			// T mode, calculate paint values.
			const deUint8	R1a			= (deUint8)getBits(src, 59, 60);
			const deUint8	R1b			= (deUint8)getBits(src, 56, 57);
			const deUint8	G1			= (deUint8)getBits(src, 52, 55);
			const deUint8	B1			= (deUint8)getBits(src, 48, 51);
			const deUint8	R2			= (deUint8)getBits(src, 44, 47);
			const deUint8	G2			= (deUint8)getBits(src, 40, 43);
			const deUint8	B2			= (deUint8)getBits(src, 36, 39);
			const deUint32	distNdx		= (getBits(src, 34, 35) << 1) | getBit(src, 32);
			const int		dist		= distTable[distNdx];

			paintR[0] = extend4To8((deUint8)((R1a << 2) | R1b));
			paintG[0] = extend4To8(G1);
			paintB[0] = extend4To8(B1);
			paintR[2] = extend4To8(R2);
			paintG[2] = extend4To8(G2);
			paintB[2] = extend4To8(B2);
			paintR[1] = (deUint8)deClamp32((int)paintR[2] + dist, 0, 255);
			paintG[1] = (deUint8)deClamp32((int)paintG[2] + dist, 0, 255);
			paintB[1] = (deUint8)deClamp32((int)paintB[2] + dist, 0, 255);
			paintR[3] = (deUint8)deClamp32((int)paintR[2] - dist, 0, 255);
			paintG[3] = (deUint8)deClamp32((int)paintG[2] - dist, 0, 255);
			paintB[3] = (deUint8)deClamp32((int)paintB[2] - dist, 0, 255);
		}
		else
		{
			// H mode, calculate paint values.
			const deUint8	R1		= (deUint8)getBits(src, 59, 62);
			const deUint8	G1a		= (deUint8)getBits(src, 56, 58);
			const deUint8	G1b		= (deUint8)getBit(src, 52);
			const deUint8	B1a		= (deUint8)getBit(src, 51);
			const deUint8	B1b		= (deUint8)getBits(src, 47, 49);
			const deUint8	R2		= (deUint8)getBits(src, 43, 46);
			const deUint8	G2		= (deUint8)getBits(src, 39, 42);
			const deUint8	B2		= (deUint8)getBits(src, 35, 38);
			deUint8			baseR[2];
			deUint8			baseG[2];
			deUint8			baseB[2];
			deUint32		baseValue[2];
			deUint32		distNdx;
			int				dist;

			baseR[0]		= extend4To8(R1);
			baseG[0]		= extend4To8((deUint8)((G1a << 1) | G1b));
			baseB[0]		= extend4To8((deUint8)((B1a << 3) | B1b));
			baseR[1]		= extend4To8(R2);
			baseG[1]		= extend4To8(G2);
			baseB[1]		= extend4To8(B2);
			baseValue[0]	= (((deUint32)baseR[0]) << 16) | (((deUint32)baseG[0]) << 8) | baseB[0];
			baseValue[1]	= (((deUint32)baseR[1]) << 16) | (((deUint32)baseG[1]) << 8) | baseB[1];
			distNdx			= (getBit(src, 34) << 2) | (getBit(src, 32) << 1) | (deUint32)(baseValue[0] >= baseValue[1]);
			dist			= distTable[distNdx];

			paintR[0]		= (deUint8)deClamp32((int)baseR[0] + dist, 0, 255);
			paintG[0]		= (deUint8)deClamp32((int)baseG[0] + dist, 0, 255);
			paintB[0]		= (deUint8)deClamp32((int)baseB[0] + dist, 0, 255);
			paintR[1]		= (deUint8)deClamp32((int)baseR[0] - dist, 0, 255);
			paintG[1]		= (deUint8)deClamp32((int)baseG[0] - dist, 0, 255);
			paintB[1]		= (deUint8)deClamp32((int)baseB[0] - dist, 0, 255);
			paintR[2]		= (deUint8)deClamp32((int)baseR[1] + dist, 0, 255);
			paintG[2]		= (deUint8)deClamp32((int)baseG[1] + dist, 0, 255);
			paintB[2]		= (deUint8)deClamp32((int)baseB[1] + dist, 0, 255);
			paintR[3]		= (deUint8)deClamp32((int)baseR[1] - dist, 0, 255);
			paintG[3]		= (deUint8)deClamp32((int)baseG[1] - dist, 0, 255);
			paintB[3]		= (deUint8)deClamp32((int)baseB[1] - dist, 0, 255);
		}

		// Write final pixels for T or H mode.
		for (int pixelNdx = 0; pixelNdx < ETC2_BLOCK_HEIGHT*ETC2_BLOCK_WIDTH; pixelNdx++)
		{
			const int		x				= pixelNdx / ETC2_BLOCK_HEIGHT;
			const int		y				= pixelNdx % ETC2_BLOCK_HEIGHT;
			const int		dstOffset		= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_RGB8;
			const deUint32	paintNdx		= (getBit(src, 16+pixelNdx) << 1) | getBit(src, pixelNdx);
			const int		alphaDstOffset	= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_A8; // Only needed for PUNCHTHROUGH version.

			if (alphaMode && diffOpaqueBit == 0 && paintNdx == 2)
			{
				dst[dstOffset+0]			= 0;
				dst[dstOffset+1]			= 0;
				dst[dstOffset+2]			= 0;
				alphaDst[alphaDstOffset]	= 0;
			}
			else
			{
				dst[dstOffset+0] = (deUint8)deClamp32((int)paintR[paintNdx], 0, 255);
				dst[dstOffset+1] = (deUint8)deClamp32((int)paintG[paintNdx], 0, 255);
				dst[dstOffset+2] = (deUint8)deClamp32((int)paintB[paintNdx], 0, 255);

				if (alphaMode)
					alphaDst[alphaDstOffset] = 255;
			}
		}
	}
	else
	{
		// Planar mode.
		const deUint8 GO1	= (deUint8)getBit(src, 56);
		const deUint8 GO2	= (deUint8)getBits(src, 49, 54);
		const deUint8 BO1	= (deUint8)getBit(src, 48);
		const deUint8 BO2	= (deUint8)getBits(src, 43, 44);
		const deUint8 BO3	= (deUint8)getBits(src, 39, 41);
		const deUint8 RH1	= (deUint8)getBits(src, 34, 38);
		const deUint8 RH2	= (deUint8)getBit(src, 32);
		const deUint8 RO	= extend6To8((deUint8)getBits(src, 57, 62));
		const deUint8 GO	= extend7To8((deUint8)((GO1 << 6) | GO2));
		const deUint8 BO	= extend6To8((deUint8)((BO1 << 5) | (BO2 << 3) | BO3));
		const deUint8 RH	= extend6To8((deUint8)((RH1 << 1) | RH2));
		const deUint8 GH	= extend7To8((deUint8)getBits(src, 25, 31));
		const deUint8 BH	= extend6To8((deUint8)getBits(src, 19, 24));
		const deUint8 RV	= extend6To8((deUint8)getBits(src, 13, 18));
		const deUint8 GV	= extend7To8((deUint8)getBits(src, 6, 12));
		const deUint8 BV	= extend6To8((deUint8)getBits(src, 0, 5));

		// Write final pixels for planar mode.
		for (int y = 0; y < 4; y++)
		{
			for (int x = 0; x < 4; x++)
			{
				const int dstOffset			= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_RGB8;
				const int unclampedR		= (x * ((int)RH-(int)RO) + y * ((int)RV-(int)RO) + 4*(int)RO + 2) >> 2;
				const int unclampedG		= (x * ((int)GH-(int)GO) + y * ((int)GV-(int)GO) + 4*(int)GO + 2) >> 2;
				const int unclampedB		= (x * ((int)BH-(int)BO) + y * ((int)BV-(int)BO) + 4*(int)BO + 2) >> 2;
				const int alphaDstOffset	= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_A8; // Only needed for PUNCHTHROUGH version.

				dst[dstOffset+0] = (deUint8)deClamp32(unclampedR, 0, 255);
				dst[dstOffset+1] = (deUint8)deClamp32(unclampedG, 0, 255);
				dst[dstOffset+2] = (deUint8)deClamp32(unclampedB, 0, 255);

				if (alphaMode)
					alphaDst[alphaDstOffset] = 255;
			}
		}
	}
}